

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseEqn.c
# Opt level: O0

Hop_Obj_t *
Parse_FormulaParserEqn(FILE *pOutput,char *pFormInit,Vec_Ptr_t *vVarNames,Hop_Man_t *pMan)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  char *__s;
  Parse_StackFn_t *p;
  Parse_StackOp_t *p_00;
  char *__s2;
  Hop_Obj_t *pHVar4;
  bool bVar5;
  int local_80;
  uint local_7c;
  int v;
  int i;
  int Oper2;
  int Oper1;
  int Oper;
  int Flag;
  int fFound;
  int nParans;
  char *pName;
  char *pTemp;
  Hop_Obj_t *gFunc;
  Parse_StackOp_t *pStackOp;
  Parse_StackFn_t *pStackFn;
  char *pFormula;
  Hop_Man_t *pMan_local;
  Vec_Ptr_t *vVarNames_local;
  char *pFormInit_local;
  FILE *pOutput_local;
  
  Flag = 0;
  for (pName = pFormInit; *pName != '\0'; pName = pName + 1) {
    if (*pName == '(') {
      Flag = Flag + 1;
    }
    else if (*pName == ')') {
      Flag = Flag + -1;
    }
  }
  if (Flag == 0) {
    sVar3 = strlen(pFormInit);
    __s = (char *)malloc(sVar3 + 3);
    sprintf(__s,"(%s)",pFormInit);
    p = Parse_StackFnStart(1000);
    p_00 = Parse_StackOpStart(1000);
    Oper1 = 1;
    for (pName = __s; *pName != '\0'; pName = pName + 1) {
      switch(*pName) {
      case '\t':
      case '\n':
      case '\r':
      case ' ':
        goto LAB_00567505;
      default:
        local_7c = 0;
        while( true ) {
          bVar5 = false;
          if (((((pName[(int)local_7c] != '\0') && (bVar5 = false, pName[(int)local_7c] != ' ')) &&
               (bVar5 = false, pName[(int)local_7c] != '\t')) &&
              ((bVar5 = false, pName[(int)local_7c] != '\r' &&
               (bVar5 = false, pName[(int)local_7c] != '\n')))) &&
             ((bVar5 = false, pName[(int)local_7c] != '*' &&
              (bVar5 = false, pName[(int)local_7c] != '+')))) {
            bVar5 = pName[(int)local_7c] != ')';
          }
          if (!bVar5) goto LAB_00567289;
          if ((pName[(int)local_7c] == '!') || (pName[(int)local_7c] == '(')) break;
          local_7c = local_7c + 1;
        }
        fprintf((FILE *)pOutput,
                "Parse_FormulaParserEqn(): The negation sign or an opening parenthesis inside the variable name.\n"
               );
        Oper1 = 4;
LAB_00567289:
        bVar5 = false;
        for (local_80 = 0; iVar1 = Vec_PtrSize(vVarNames), local_80 < iVar1; local_80 = local_80 + 1
            ) {
          __s2 = (char *)Vec_PtrEntry(vVarNames,local_80);
          iVar1 = strncmp(pName,__s2,(long)(int)local_7c);
          if ((iVar1 == 0) && (sVar3 = strlen(__s2), sVar3 == local_7c)) {
            pName = pName + (int)(local_7c - 1);
            bVar5 = true;
            break;
          }
        }
        if (bVar5) {
          if (Oper1 == 2) {
            fprintf((FILE *)pOutput,
                    "Parse_FormulaParserEqn(): The variable name \"%s\" follows another var without operation sign.\n"
                    ,pName);
            Oper1 = 4;
          }
          else {
            pHVar4 = Hop_IthVar(pMan,local_80);
            Parse_StackFnPush(p,pHVar4);
            Oper1 = 2;
          }
        }
        else {
          fprintf((FILE *)pOutput,
                  "Parse_FormulaParserEqn(): The parser cannot find var \"%s\" in the input var list.\n"
                  ,pName);
          Oper1 = 4;
        }
        break;
      case '!':
        if (Oper1 == 2) {
          Parse_StackOpPush(p_00,9);
          Oper1 = 3;
        }
        Parse_StackOpPush(p_00,10);
        break;
      case '(':
        if (Oper1 == 2) {
          fprintf((FILE *)pOutput,
                  "Parse_FormulaParserEqn(): An opening parenthesis follows a var without operation sign.\n"
                 );
          Oper1 = 4;
        }
        else {
          Parse_StackOpPush(p_00,1);
          Oper1 = 1;
        }
        break;
      case ')':
        iVar1 = Parse_StackOpIsEmpty(p_00);
        if (iVar1 == 0) {
          while (iVar1 = Parse_StackOpIsEmpty(p_00), iVar1 == 0) {
            iVar1 = Parse_StackOpPop(p_00);
            if (iVar1 == 1) goto LAB_00567128;
            pHVar4 = Parse_ParserPerformTopOp(pMan,p,iVar1);
            if (pHVar4 == (Hop_Obj_t *)0x0) {
              Parse_StackFnFree(p);
              Parse_StackOpFree(p_00);
              fprintf((FILE *)pOutput,"Parse_FormulaParserEqn(): Unknown operation\n");
              if (__s != (char *)0x0) {
                free(__s);
              }
              return (Hop_Obj_t *)0x0;
            }
          }
          fprintf((FILE *)pOutput,"Parse_FormulaParserEqn(): There is no opening parenthesis\n");
          Oper1 = 4;
LAB_00567128:
          if (Oper1 != 4) {
            Oper1 = 2;
          }
        }
        else {
          fprintf((FILE *)pOutput,"Parse_FormulaParserEqn(): There is no opening parenthesis\n");
          Oper1 = 4;
        }
        break;
      case '*':
      case '+':
        if (Oper1 == 2) {
          if (*pName == '*') {
            Parse_StackOpPush(p_00,9);
          }
          else {
            Parse_StackOpPush(p_00,7);
          }
          Oper1 = 3;
        }
        else {
          fprintf((FILE *)pOutput,
                  "Parse_FormulaParserEqn(): There is no variable before AND, EXOR, or OR.\n");
          Oper1 = 4;
        }
        break;
      case '0':
        pHVar4 = Hop_ManConst0(pMan);
        Parse_StackFnPush(p,pHVar4);
        if (Oper1 == 2) {
          fprintf((FILE *)pOutput,
                  "Parse_FormulaParserEqn(): No operation symbol before constant 0.\n");
          Oper1 = 4;
        }
        else {
          Oper1 = 2;
        }
        break;
      case '1':
        pHVar4 = Hop_ManConst1(pMan);
        Parse_StackFnPush(p,pHVar4);
        if (Oper1 == 2) {
          fprintf((FILE *)pOutput,
                  "Parse_FormulaParserEqn(): No operation symbol before constant 1.\n");
          Oper1 = 4;
        }
        else {
          Oper1 = 2;
        }
      }
      if (Oper1 == 4) break;
      if (Oper1 != 1) {
        if (Oper1 == 2) {
          while (iVar1 = Parse_StackOpIsEmpty(p_00), iVar1 == 0) {
            iVar1 = Parse_StackOpPop(p_00);
            if (iVar1 != 10) {
              Parse_StackOpPush(p_00,iVar1);
              break;
            }
            pHVar4 = (Hop_Obj_t *)Parse_StackFnPop(p);
            pHVar4 = Hop_Not(pHVar4);
            Parse_StackFnPush(p,pHVar4);
          }
        }
        else {
          while( true ) {
            iVar1 = Parse_StackOpPop(p_00);
            iVar2 = Parse_StackOpIsEmpty(p_00);
            if (iVar2 != 0) break;
            iVar2 = Parse_StackOpPop(p_00);
            if (iVar2 < iVar1) {
              Parse_StackOpPush(p_00,iVar2);
              Parse_StackOpPush(p_00,iVar1);
              goto LAB_00567505;
            }
            pHVar4 = Parse_ParserPerformTopOp(pMan,p,iVar2);
            if (pHVar4 == (Hop_Obj_t *)0x0) {
              fprintf((FILE *)pOutput,"Parse_FormulaParserEqn(): Unknown operation\n");
              if (__s != (char *)0x0) {
                free(__s);
              }
              Parse_StackFnFree(p);
              Parse_StackOpFree(p_00);
              return (Hop_Obj_t *)0x0;
            }
            Parse_StackOpPush(p_00,iVar1);
          }
          Parse_StackOpPush(p_00,iVar1);
        }
      }
LAB_00567505:
    }
    if (Oper1 != 4) {
      iVar1 = Parse_StackFnIsEmpty(p);
      if (iVar1 == 0) {
        pHVar4 = (Hop_Obj_t *)Parse_StackFnPop(p);
        iVar1 = Parse_StackFnIsEmpty(p);
        if (iVar1 == 0) {
          fprintf((FILE *)pOutput,
                  "Parse_FormulaParserEqn(): Something is left in the function stack\n");
        }
        else {
          iVar1 = Parse_StackOpIsEmpty(p_00);
          if (iVar1 != 0) {
            Parse_StackFnFree(p);
            Parse_StackOpFree(p_00);
            if (__s != (char *)0x0) {
              free(__s);
              return pHVar4;
            }
            return pHVar4;
          }
          fprintf((FILE *)pOutput,
                  "Parse_FormulaParserEqn(): Something is left in the operation stack\n");
        }
      }
      else {
        fprintf((FILE *)pOutput,"Parse_FormulaParserEqn(): The input string is empty\n");
      }
    }
    if (__s != (char *)0x0) {
      free(__s);
    }
  }
  else {
    fprintf((FILE *)pOutput,
            "Parse_FormulaParserEqn(): Different number of opening and closing parentheses ().\n");
  }
  return (Hop_Obj_t *)0x0;
}

Assistant:

Hop_Obj_t * Parse_FormulaParserEqn( FILE * pOutput, char * pFormInit, Vec_Ptr_t * vVarNames, Hop_Man_t * pMan )
{
    char * pFormula;
    Parse_StackFn_t * pStackFn;
    Parse_StackOp_t * pStackOp;
    Hop_Obj_t * gFunc;
    char * pTemp, * pName;
    int nParans, fFound, Flag;
	int Oper, Oper1, Oper2;
    int i, v;

    // make sure that the number of opening and closing parentheses is the same
    nParans = 0;
    for ( pTemp = pFormInit; *pTemp; pTemp++ )
        if ( *pTemp == '(' )
            nParans++;
        else if ( *pTemp == ')' )
            nParans--;
    if ( nParans != 0 )
    {
        fprintf( pOutput, "Parse_FormulaParserEqn(): Different number of opening and closing parentheses ().\n" );
        return NULL;
    }

    // copy the formula
    pFormula = ABC_ALLOC( char, strlen(pFormInit) + 3 );
    sprintf( pFormula, "(%s)", pFormInit );

    // start the stacks
    pStackFn = Parse_StackFnStart( PARSE_EQN_STACKSIZE );
    pStackOp = Parse_StackOpStart( PARSE_EQN_STACKSIZE );

    Flag = PARSE_EQN_FLAG_START;
    for ( pTemp = pFormula; *pTemp; pTemp++ )
	{
		switch ( *pTemp )
	    {
		// skip all spaces, tabs, and end-of-lines
        case ' ':
        case '\t':
        case '\r':
        case '\n':
			continue;
		case PARSE_EQN_SYM_CONST0:
		    Parse_StackFnPush( pStackFn, Hop_ManConst0(pMan) );  // Cudd_Ref( b0 );
			if ( Flag == PARSE_EQN_FLAG_VAR )
			{
				fprintf( pOutput, "Parse_FormulaParserEqn(): No operation symbol before constant 0.\n" );
				Flag = PARSE_EQN_FLAG_ERROR; 
                break;
			}
            Flag = PARSE_EQN_FLAG_VAR; 
            break;
		case PARSE_EQN_SYM_CONST1:
		    Parse_StackFnPush( pStackFn, Hop_ManConst1(pMan) );  //  Cudd_Ref( b1 );
			if ( Flag == PARSE_EQN_FLAG_VAR )
			{
				fprintf( pOutput, "Parse_FormulaParserEqn(): No operation symbol before constant 1.\n" );
				Flag = PARSE_EQN_FLAG_ERROR; 
                break;
			}
            Flag = PARSE_EQN_FLAG_VAR; 
            break;
		case PARSE_EQN_SYM_NEG:
			if ( Flag == PARSE_EQN_FLAG_VAR )
			{// if NEGBEF follows a variable, AND is assumed
				Parse_StackOpPush( pStackOp, PARSE_EQN_OPER_AND );
				Flag = PARSE_EQN_FLAG_OPER;
			}
    		Parse_StackOpPush( pStackOp, PARSE_EQN_OPER_NEG );
			break;
        case PARSE_EQN_SYM_AND:
        case PARSE_EQN_SYM_OR:
			if ( Flag != PARSE_EQN_FLAG_VAR )
			{
				fprintf( pOutput, "Parse_FormulaParserEqn(): There is no variable before AND, EXOR, or OR.\n" );
				Flag = PARSE_EQN_FLAG_ERROR; 
                break;
			}
			if ( *pTemp == PARSE_EQN_SYM_AND )
				Parse_StackOpPush( pStackOp, PARSE_EQN_OPER_AND );
			else //if ( *pTemp == PARSE_EQN_SYM_OR )
				Parse_StackOpPush( pStackOp, PARSE_EQN_OPER_OR );
			Flag = PARSE_EQN_FLAG_OPER; 
            break;
		case PARSE_EQN_SYM_OPEN:
			if ( Flag == PARSE_EQN_FLAG_VAR )
            {
//				Parse_StackOpPush( pStackOp, PARSE_EQN_OPER_AND );
				fprintf( pOutput, "Parse_FormulaParserEqn(): An opening parenthesis follows a var without operation sign.\n" ); 
				Flag = PARSE_EQN_FLAG_ERROR; 
                break; 
            }
			Parse_StackOpPush( pStackOp, PARSE_EQN_OPER_MARK );
			// after an opening bracket, it feels like starting over again
			Flag = PARSE_EQN_FLAG_START; 
            break;
		case PARSE_EQN_SYM_CLOSE:
			if ( !Parse_StackOpIsEmpty( pStackOp ) )
            {
				while ( 1 )
			    {
				    if ( Parse_StackOpIsEmpty( pStackOp ) )
					{
						fprintf( pOutput, "Parse_FormulaParserEqn(): There is no opening parenthesis\n" );
						Flag = PARSE_EQN_FLAG_ERROR; 
                        break;
					}
					Oper = Parse_StackOpPop( pStackOp );
					if ( Oper == PARSE_EQN_OPER_MARK )
						break;

                    // perform the given operation
                    if ( Parse_ParserPerformTopOp( pMan, pStackFn, Oper ) == NULL )
	                {
                        Parse_StackFnFree( pStackFn );
                        Parse_StackOpFree( pStackOp );
		                fprintf( pOutput, "Parse_FormulaParserEqn(): Unknown operation\n" );
                        ABC_FREE( pFormula );
		                return NULL;
	                }
			    }
            }
		    else
			{
				fprintf( pOutput, "Parse_FormulaParserEqn(): There is no opening parenthesis\n" );
				Flag = PARSE_EQN_FLAG_ERROR; 
                break;
			}
			if ( Flag != PARSE_EQN_FLAG_ERROR )
			    Flag = PARSE_EQN_FLAG_VAR; 
			break;


		default:
            // scan the next name
            for ( i = 0; pTemp[i] && 
                         pTemp[i] != ' ' && pTemp[i] != '\t' && pTemp[i] != '\r' && pTemp[i] != '\n' &&
                         pTemp[i] != PARSE_EQN_SYM_AND && pTemp[i] != PARSE_EQN_SYM_OR && pTemp[i] != PARSE_EQN_SYM_CLOSE; i++ )
              {
				    if ( pTemp[i] == PARSE_EQN_SYM_NEG || pTemp[i] == PARSE_EQN_SYM_OPEN )
				    {
					    fprintf( pOutput, "Parse_FormulaParserEqn(): The negation sign or an opening parenthesis inside the variable name.\n" );
					    Flag = PARSE_EQN_FLAG_ERROR; 
                        break;
				    }
              }
            // variable name is found
            fFound = 0;
            Vec_PtrForEachEntry( char *, vVarNames, pName, v )
                if ( strncmp(pTemp, pName, i) == 0 && strlen(pName) == (unsigned)i )
                {
                    pTemp += i-1;
                    fFound = 1;
                    break;
                }
            if ( !fFound )
			{ 
				fprintf( pOutput, "Parse_FormulaParserEqn(): The parser cannot find var \"%s\" in the input var list.\n", pTemp ); 
				Flag = PARSE_EQN_FLAG_ERROR; 
                break; 
			}
			if ( Flag == PARSE_EQN_FLAG_VAR )
            {
				fprintf( pOutput, "Parse_FormulaParserEqn(): The variable name \"%s\" follows another var without operation sign.\n", pTemp ); 
				Flag = PARSE_EQN_FLAG_ERROR; 
                break; 
            }
			Parse_StackFnPush( pStackFn, Hop_IthVar( pMan, v ) ); // Cudd_Ref( pbVars[v] );
            Flag = PARSE_EQN_FLAG_VAR; 
            break;
	    }

		if ( Flag == PARSE_EQN_FLAG_ERROR )
			break;      // error exit
		else if ( Flag == PARSE_EQN_FLAG_START )
			continue;  //  go on parsing
		else if ( Flag == PARSE_EQN_FLAG_VAR )
			while ( 1 )
			{  // check if there are negations in the OpStack     
				if ( Parse_StackOpIsEmpty(pStackOp) )
					break;
                Oper = Parse_StackOpPop( pStackOp );
				if ( Oper != PARSE_EQN_OPER_NEG )
                {
					Parse_StackOpPush( pStackOp, Oper );
					break;
                }
				else
				{
      				Parse_StackFnPush( pStackFn, Hop_Not((Hop_Obj_t *)Parse_StackFnPop(pStackFn)) );
				}
			}
		else // if ( Flag == PARSE_EQN_FLAG_OPER )
			while ( 1 )
			{  // execute all the operations in the OpStack
			   // with precedence higher or equal than the last one
				Oper1 = Parse_StackOpPop( pStackOp ); // the last operation
				if ( Parse_StackOpIsEmpty(pStackOp) ) 
				{  // if it is the only operation, push it back
					Parse_StackOpPush( pStackOp, Oper1 );
					break;
				}
				Oper2 = Parse_StackOpPop( pStackOp ); // the operation before the last one
				if ( Oper2 >= Oper1 )  
				{  // if Oper2 precedence is higher or equal, execute it
                    if ( Parse_ParserPerformTopOp( pMan, pStackFn, Oper2 ) == NULL )
	                {
		                fprintf( pOutput, "Parse_FormulaParserEqn(): Unknown operation\n" );
                        ABC_FREE( pFormula );
                        Parse_StackFnFree( pStackFn );
                        Parse_StackOpFree( pStackOp );
		                return NULL;
	                }
					Parse_StackOpPush( pStackOp,  Oper1 );     // push the last operation back
				}
				else
				{  // if Oper2 precedence is lower, push them back and done
					Parse_StackOpPush( pStackOp, Oper2 );
					Parse_StackOpPush( pStackOp, Oper1 );
					break;
				}
			}
    }

	if ( Flag != PARSE_EQN_FLAG_ERROR )
    {
		if ( !Parse_StackFnIsEmpty(pStackFn) )
	    {	
			gFunc = (Hop_Obj_t *)Parse_StackFnPop(pStackFn);
			if ( Parse_StackFnIsEmpty(pStackFn) )
				if ( Parse_StackOpIsEmpty(pStackOp) )
                {
                    Parse_StackFnFree(pStackFn);
                    Parse_StackOpFree(pStackOp);
//                    Cudd_Deref( gFunc );
                    ABC_FREE( pFormula );
					return gFunc;
                }
				else
					fprintf( pOutput, "Parse_FormulaParserEqn(): Something is left in the operation stack\n" );
			else
				fprintf( pOutput, "Parse_FormulaParserEqn(): Something is left in the function stack\n" );
	    }
	    else
			fprintf( pOutput, "Parse_FormulaParserEqn(): The input string is empty\n" );
    }
    ABC_FREE( pFormula );
	return NULL;
}